

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_advection_diffusion_reaction_splitting.c
# Opt level: O0

int f_diffusion(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  long *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  double dVar4;
  sunindextype i;
  sunrealtype coeff;
  sunrealtype *Ydot;
  sunrealtype *Y;
  UserData *udata;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  long lVar5;
  void *in_stack_ffffffffffffffb8;
  int local_4;
  
  pdVar2 = (double *)N_VGetArrayPointer(in_RDI);
  iVar1 = check_flag(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  if (iVar1 == 0) {
    pdVar3 = (double *)N_VGetArrayPointer(in_RSI);
    iVar1 = check_flag(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac
                      );
    if (iVar1 == 0) {
      dVar4 = (double)in_RDX[3] / ((double)in_RDX[1] * (double)in_RDX[1]);
      *pdVar3 = dVar4 * (((double)in_RDX[5] - (*pdVar2 + *pdVar2)) + pdVar2[1]);
      for (lVar5 = 1; lVar5 < *in_RDX + -1; lVar5 = lVar5 + 1) {
        pdVar3[lVar5] =
             dVar4 * ((pdVar2[lVar5 + 1] - (pdVar2[lVar5] + pdVar2[lVar5])) + pdVar2[lVar5 + -1]);
      }
      pdVar3[*in_RDX + -1] =
           dVar4 * ((pdVar2[*in_RDX + -2] - (pdVar2[*in_RDX + -1] + pdVar2[*in_RDX + -1])) +
                   (double)in_RDX[5]);
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int f_diffusion(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData* udata = (UserData*)user_data;
  sunrealtype* Y  = NULL;
  Y               = N_VGetArrayPointer(y); /* access data arrays */
  if (check_flag((void*)Y, "N_VGetArrayPointer", 0)) { return 1; }

  sunrealtype* Ydot = NULL;
  Ydot              = N_VGetArrayPointer(ydot);
  if (check_flag((void*)Ydot, "N_VGetArrayPointer", 0)) { return 1; }

  sunrealtype coeff = udata->b / (udata->dx * udata->dx);

  /* Left boundary */
  Ydot[0] = coeff * (udata->u0 - 2 * Y[0] + Y[1]);
  /* Interior */
  for (sunindextype i = 1; i < udata->N - 1; i++)
  {
    Ydot[i] = coeff * (Y[i + 1] - 2 * Y[i] + Y[i - 1]);
  }
  /* Right boundary */
  Ydot[udata->N - 1] = coeff *
                       (Y[udata->N - 2] - 2 * Y[udata->N - 1] + udata->u0);

  return 0;
}